

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::usda::USDAReader::Impl::ReconstructPrim<tinyusdz::GeomCone>
          (Impl *this,Specifier *spec,PropertyMap *properties,ReferenceList *references,
          GeomCone *prim)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *warn;
  string err;
  ostringstream ss_e;
  allocator local_22a;
  PrimReconstructOptions local_229;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8 [32];
  ostringstream local_1a8 [376];
  
  local_229.strict_allowedToken_check = (this->_config).strict_allowedToken_check;
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  warn = &this->_warn;
  bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCone>
                    (spec,properties,references,prim,warn,&local_228,&local_229);
  if (!bVar1) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReconstructPrim");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x657);
    ::std::operator<<(poVar2," ");
    ::std::__cxx11::string::string(local_1c8,"Failed to reconstruct {} Prim: {}",&local_22a);
    tinyusdz::value::TypeTraits<tinyusdz::GeomCone>::type_name_abi_cxx11_();
    fmt::format<std::__cxx11::string,std::__cxx11::string>
              (&local_208,(fmt *)local_1c8,&local_1e8,&local_228,warn);
    poVar2 = ::std::operator<<((ostream *)local_1a8,(string *)&local_208);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  ::std::__cxx11::string::_M_dispose();
  return bVar1;
}

Assistant:

bool USDAReader::Impl::ReconstructPrim(
    const Specifier &spec,
    const prim::PropertyMap &properties,
    const prim::ReferenceList &references,
    T *prim) {

  prim::PrimReconstructOptions options;
  options.strict_allowedToken_check = _config.strict_allowedToken_check;
  DCOUT("strict_allowedToken_check " << options.strict_allowedToken_check);

  std::string err;
  if (!prim::ReconstructPrim(spec, properties, references, prim, &_warn, &err, options)) {
    PUSH_ERROR_AND_RETURN(fmt::format("Failed to reconstruct {} Prim: {}", value::TypeTraits<T>::type_name(), err));
  }
  return true;
}